

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

type __thiscall
duckdb::Deserializer::
Read<duckdb::unique_ptr<duckdb::BoundOrderModifier,std::default_delete<duckdb::BoundOrderModifier>,true>,duckdb::BoundOrderModifier>
          (Deserializer *this)

{
  byte bVar1;
  long *in_RSI;
  unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_> in_RDI;
  bool is_present;
  unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true> *ptr
  ;
  nullptr_t in_stack_ffffffffffffffa8;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> this_00;
  unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
  local_30 [3];
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 uVar2;
  
  uVar2 = 0;
  this_00._M_head_impl =
       (BoundOrderModifier *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
       .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
  unique_ptr<duckdb::BoundOrderModifier,std::default_delete<duckdb::BoundOrderModifier>,true>::
  unique_ptr<std::default_delete<duckdb::BoundOrderModifier>,void>
            ((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
              *)in_RDI._M_t.
                super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
                .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl,
             in_stack_ffffffffffffffa8);
  bVar1 = (**(code **)(*in_RSI + 0x50))();
  bVar1 = bVar1 & 1;
  if (bVar1 != 0) {
    (**(code **)(*in_RSI + 0x30))();
    BoundOrderModifier::Deserialize
              ((Deserializer *)CONCAT17(uVar2,CONCAT16(bVar1,in_stack_ffffffffffffffe8)));
    unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>::
    operator=((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
               *)this_00._M_head_impl,local_30);
    unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>::
    ~unique_ptr((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                 *)0xb42e95);
    (**(code **)(*in_RSI + 0x38))();
  }
  (**(code **)(*in_RSI + 0x58))();
  return (unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>)
         (__uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
           .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
}

Assistant:

inline typename std::enable_if<is_unique_ptr<T>::value && has_deserialize<ELEMENT_TYPE>::value, T>::type Read() {
		unique_ptr<ELEMENT_TYPE> ptr = nullptr;
		auto is_present = OnNullableBegin();
		if (is_present) {
			OnObjectBegin();
			ptr = ELEMENT_TYPE::Deserialize(*this);
			OnObjectEnd();
		}
		OnNullableEnd();
		return ptr;
	}